

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-knowledge.c
# Opt level: O1

void shape_learn_on_assume(player *p,char *name)

{
  wchar_t flag;
  player_shape *ppVar1;
  long lVar2;
  bitflag f [6];
  bitflag obvious_mask [6];
  bitflag local_34 [6];
  bitflag local_2e [6];
  
  ppVar1 = lookup_player_shape(name);
  create_obj_flag_mask(local_2e,L'\x01',3,10);
  flag_copy(local_34,ppVar1->flags,6);
  flag_inter(local_34,local_2e,6);
  flag = flag_next(local_34,6,1);
  if (flag != L'\0') {
    do {
      equip_learn_flag(p,flag);
      flag = flag_next(local_34,6,flag + L'\x01');
    } while (flag != L'\0');
  }
  lVar2 = 0;
  do {
    if ((ppVar1->el_info[lVar2].res_level != 0) && (p->obj_k->el_info[lVar2].res_level == 0)) {
      equip_learn_element(p,(wchar_t)lVar2);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x1c);
  return;
}

Assistant:

void shape_learn_on_assume(struct player *p, const char *name)
{
	bitflag f[OF_SIZE], obvious_mask[OF_SIZE];
	int flag, element;
	struct player_shape *shape = lookup_player_shape(name);

	/* Get the shape's obvious flags */
	create_obj_flag_mask(obvious_mask, true, OFID_WIELD, OFT_MAX);
	of_copy(f, shape->flags);
	of_inter(f, obvious_mask);

	/* Learn flags */
	for (flag = of_next(f, FLAG_START); flag != FLAG_END;
		 flag = of_next(f, flag + 1)) {
		equip_learn_flag(p, flag);
	}

	/* Learn elements */
	for (element = 0; element < ELEM_MAX; element++) {
		if (shape->el_info[element].res_level &&
			!p->obj_k->el_info[element].res_level) {
			equip_learn_element(p, element);
		}
	}
}